

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O2

SUNLinearSolver SUNLinSol_Dense(N_Vector y,SUNMatrix A)

{
  int iVar1;
  long lVar2;
  long lVar3;
  sunindextype sVar4;
  SUNLinearSolver __ptr;
  _generic_SUNLinearSolver_Ops *__ptr_00;
  long *__ptr_01;
  void *pvVar5;
  
  iVar1 = SUNMatGetID(A);
  if (iVar1 == 0) {
    lVar2 = SUNDenseMatrix_Rows(A);
    lVar3 = SUNDenseMatrix_Columns(A);
    if (lVar2 == lVar3) {
      lVar2 = SUNDenseMatrix_Rows(A);
      iVar1 = N_VGetVectorID(y);
      if ((((iVar1 == 0) || (iVar1 = N_VGetVectorID(y), iVar1 == 2)) ||
          (iVar1 = N_VGetVectorID(y), iVar1 == 3)) &&
         ((sVar4 = GlobalVectorLength_DenseLS(y), lVar2 == sVar4 &&
          (__ptr = (SUNLinearSolver)malloc(0x10), __ptr != (SUNLinearSolver)0x0)))) {
        __ptr_00 = (_generic_SUNLinearSolver_Ops *)malloc(0x68);
        if (__ptr_00 != (_generic_SUNLinearSolver_Ops *)0x0) {
          __ptr_00->gettype = SUNLinSolGetType_Dense;
          __ptr_00->initialize = SUNLinSolInitialize_Dense;
          __ptr_00->setup = SUNLinSolSetup_Dense;
          __ptr_00->solve = SUNLinSolSolve_Dense;
          __ptr_00->lastflag = SUNLinSolLastFlag_Dense;
          __ptr_00->space = SUNLinSolSpace_Dense;
          __ptr_00->free = SUNLinSolFree_Dense;
          __ptr_00->resid = (_func_N_Vector_SUNLinearSolver *)0x0;
          __ptr_01 = (long *)malloc(0x18);
          __ptr_00->setscalingvectors = (_func_int_SUNLinearSolver_N_Vector_N_Vector *)0x0;
          __ptr_00->setatimes = (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0;
          __ptr_00->setpreconditioner = (_func_int_SUNLinearSolver_void_ptr_PSetupFn_PSolveFn *)0x0;
          __ptr_00->numiters = (_func_int_SUNLinearSolver *)0x0;
          __ptr_00->resnorm = (_func_realtype_SUNLinearSolver *)0x0;
          if (__ptr_01 != (long *)0x0) {
            *__ptr_01 = lVar2;
            pvVar5 = malloc(lVar2 << 3);
            __ptr_01[2] = 0;
            __ptr_01[1] = (long)pvVar5;
            if (pvVar5 != (void *)0x0) {
              __ptr->content = __ptr_01;
              __ptr->ops = __ptr_00;
              return __ptr;
            }
            free(__ptr_01);
          }
          free(__ptr_00);
        }
        free(__ptr);
      }
    }
  }
  return (SUNLinearSolver)0x0;
}

Assistant:

SUNLinearSolver SUNLinSol_Dense(N_Vector y, SUNMatrix A)
{
  SUNLinearSolver S;
  SUNLinearSolver_Ops ops;
  SUNLinearSolverContent_Dense content;
  sunindextype MatrixRows, VecLength;
  
  /* Check compatibility with supplied SUNMatrix and N_Vector */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE)
    return(NULL);
  if (SUNDenseMatrix_Rows(A) != SUNDenseMatrix_Columns(A))
    return(NULL);
  MatrixRows = SUNDenseMatrix_Rows(A);
  if ( (N_VGetVectorID(y) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_PTHREADS) )
    return(NULL);

  /* optimally this function would be replaced with a generic N_Vector routine */
  VecLength = GlobalVectorLength_DenseLS(y);
  if (MatrixRows != VecLength)
    return(NULL);
  
  /* Create linear solver */
  S = NULL;
  S = (SUNLinearSolver) malloc(sizeof *S);
  if (S == NULL) return(NULL);
  
  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops) malloc(sizeof(struct _generic_SUNLinearSolver_Ops));
  if (ops == NULL) { free(S); return(NULL); }

  /* Attach operations */
  ops->gettype           = SUNLinSolGetType_Dense;
  ops->initialize        = SUNLinSolInitialize_Dense;
  ops->setup             = SUNLinSolSetup_Dense;
  ops->solve             = SUNLinSolSolve_Dense;
  ops->lastflag          = SUNLinSolLastFlag_Dense;
  ops->space             = SUNLinSolSpace_Dense;
  ops->free              = SUNLinSolFree_Dense;
  ops->setatimes         = NULL;
  ops->setpreconditioner = NULL;
  ops->setscalingvectors = NULL;
  ops->numiters          = NULL;
  ops->resnorm           = NULL;
  ops->resid             = NULL;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Dense) malloc(sizeof(struct _SUNLinearSolverContent_Dense));
  if (content == NULL) { free(ops); free(S); return(NULL); }

  /* Fill content */
  content->N = MatrixRows;
  content->last_flag = 0;
  content->pivots = NULL;
  content->pivots = (sunindextype *) malloc(MatrixRows * sizeof(sunindextype));
  if (content->pivots == NULL) {
    free(content); free(ops); free(S); return(NULL);
  }
  
  /* Attach content and ops */
  S->content = content;
  S->ops     = ops;

  return(S);
}